

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::avx512::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  RTCRayQueryContext *pRVar2;
  long *plVar3;
  long lVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined8 uVar6;
  byte bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  _func_int *p_Var23;
  uint uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar49;
  vfloat4 a0_2;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar50;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_ZMM1 [64];
  int iVar69;
  vfloat4 a0_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_ZMM2 [64];
  undefined4 uVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 in_ZMM5 [64];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 in_ZMM6 [64];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 in_ZMM7 [64];
  vfloat4 a1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  RayQueryContext newcontext;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 auStack_138 [16];
  undefined1 local_128 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  auVar28 = in_ZMM6._0_16_;
  auVar32 = in_ZMM4._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  auVar33 = in_ZMM7._0_16_;
  a0_1.field_0 = in_ZMM2._0_16_;
  auVar26 = in_ZMM3._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  uVar49 = prim->primID_;
  pGVar1 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var23 = *(_func_int **)&pGVar1->field_0x58;
  if ((((p_Var23 == (_func_int *)0x0) &&
       ((uVar17 = (ulong)*(uint *)(*(long *)&pGVar1[1].time_range.upper +
                                  (long)pGVar1[1].intersectionFilterN * (ulong)uVar49),
        uVar17 == 0xffffffff ||
        (p_Var23 = pGVar1[1].super_RefCount._vptr_RefCount[uVar17], p_Var23 == (_func_int *)0x0))))
      || ((ray->mask & pGVar1->mask) == 0)) ||
     (pRVar2 = context->user, pRVar2->instID[0] != 0xffffffff)) {
    bVar16 = false;
  }
  else {
    pRVar2->instID[0] = prim->instID_;
    pRVar2->instPrimID[0] = uVar49;
    uVar17 = (ulong)prim->primID_;
    if (pGVar1->numTimeSteps == 1) {
      plVar3 = *(long **)&pGVar1[1].fnumTimeSegments;
      iVar69 = (int)plVar3[4];
      if ((pGVar1->field_8).field_0x1 == '\x01') {
        if (iVar69 == 0x9134) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x10 + lVar18)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar18)),0x28);
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x14 + lVar18)),0x1c);
          auVar32 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),0x28);
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar18)),0x28);
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x1c + lVar18)),0x1c);
          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar18)),0x28);
        }
        else if (iVar69 == 0x9234) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(lVar4 + 4 + lVar18);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar18)),_DAT_01fefe80,auVar56);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),_DAT_01fefe80,
                                       auVar73);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),_DAT_01fefe80,
                                            auVar57);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar18);
          auVar26 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),_DAT_01fefe80,
                                       auVar58);
        }
        else if (iVar69 == 0xb001) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
          auVar28 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),0x20);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar18);
          auVar33 = vpermt2ps_avx512vl(auVar63,_DAT_01fefe90,ZEXT416(*(uint *)(lVar4 + lVar18)));
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
          fVar83 = *(float *)(lVar4 + 0x24 + lVar18);
          fVar50 = *(float *)(lVar4 + 0x28 + lVar18);
          fVar25 = *(float *)(lVar4 + 0x2c + lVar18);
          auVar32 = vpermt2ps_avx512vl(auVar106,_DAT_01fefe90,
                                       ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)));
          fVar82 = *(float *)(lVar4 + 0x30 + lVar18);
          auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50)),ZEXT416((uint)fVar83),
                                    ZEXT416((uint)fVar83));
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar31 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar26._0_4_));
          fVar110 = auVar31._0_4_;
          fVar110 = fVar110 * 1.5 + fVar110 * fVar110 * fVar110 * auVar26._0_4_ * -0.5;
          auVar26 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar110 * fVar83)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416((uint)(fVar110 * fVar50)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar28,ZEXT416((uint)(fVar110 * fVar82)),0x30);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),0x10);
          auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar18)),0x20);
          auVar32 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar25 * fVar110)),0x30);
        }
        else if (iVar69 == 0x9244) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + lVar18))->v;
          auVar32 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar18);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x20 + lVar18))
                          ->v;
          auVar26 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar18);
        }
        auVar33 = vshufps_avx(auVar26,auVar26,0xff);
        auVar31 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar30 = vshufps_avx(auVar32,auVar32,0xff);
        auVar27 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar28 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
        auVar28 = vblendps_avx(auVar28,auVar32,4);
        fVar115 = auVar31._0_4_;
        auVar70 = vfmadd213ss_fma(auVar33,auVar33,ZEXT416((uint)(fVar115 * fVar115)));
        auVar70 = vfnmadd231ss_fma(auVar70,auVar30,auVar30);
        auVar29 = vfnmadd231ss_fma(auVar70,auVar27,auVar27);
        fVar110 = auVar33._0_4_;
        auVar34 = ZEXT416((uint)(auVar27._0_4_ * fVar110));
        auVar70 = vfmadd213ss_fma(auVar30,auVar31,auVar34);
        fVar83 = auVar70._0_4_ + auVar70._0_4_;
        auVar75 = ZEXT416((uint)(auVar30._0_4_ * fVar110));
        auVar70 = vfmsub213ss_fma(auVar27,auVar31,auVar75);
        fVar50 = auVar70._0_4_ + auVar70._0_4_;
        auVar70 = vfmsub231ss_fma(auVar34,auVar31,auVar30);
        fVar25 = auVar70._0_4_ + auVar70._0_4_;
        auVar70 = vfmsub231ss_fma(ZEXT416((uint)(fVar115 * fVar115)),auVar33,auVar33);
        auVar33 = vfmadd213ss_avx512f(auVar30,auVar30,auVar70);
        auVar34 = vfnmadd231ss_avx512f(auVar33,auVar27,auVar27);
        auVar33 = vfmadd213ss_avx512f(auVar27,auVar30,ZEXT416((uint)(fVar115 * fVar110)));
        auVar35 = vaddss_avx512f(auVar33,auVar33);
        auVar33 = vfmadd213ss_fma(auVar31,auVar27,auVar75);
        fVar82 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfmsub231ss_fma(ZEXT416((uint)(fVar115 * fVar110)),auVar30,auVar27);
        fVar110 = auVar33._0_4_ + auVar33._0_4_;
        auVar33 = vfnmadd231ss_fma(auVar70,auVar30,auVar30);
        auVar27 = vfmadd231ss_fma(auVar33,auVar27,auVar27);
        uVar81 = auVar29._0_4_;
        auVar123._4_4_ = uVar81;
        auVar123._0_4_ = uVar81;
        auVar123._8_4_ = uVar81;
        auVar123._12_4_ = uVar81;
        auVar129._4_4_ = fVar83;
        auVar129._0_4_ = fVar83;
        auVar129._8_4_ = fVar83;
        auVar129._12_4_ = fVar83;
        auVar133._0_4_ = fVar50 * 0.0;
        auVar133._4_4_ = fVar50 * 0.0;
        auVar133._8_4_ = fVar50 * 1.0;
        auVar133._12_4_ = fVar50 * 0.0;
        auVar70 = ZEXT816(0x3f80000000000000);
        auVar33 = vfmadd231ps_fma(auVar133,auVar70,auVar129);
        auVar29 = SUB6416(ZEXT464(0x3f800000),0);
        auVar31 = vfmadd231ps_fma(auVar33,auVar29,auVar123);
        auVar124._4_4_ = fVar25;
        auVar124._0_4_ = fVar25;
        auVar124._8_4_ = fVar25;
        auVar124._12_4_ = fVar25;
        auVar33 = vbroadcastss_avx512vl(auVar34);
        auVar30 = vbroadcastss_avx512vl(auVar35);
        auVar132._0_4_ = auVar30._0_4_ * 0.0;
        auVar132._4_4_ = auVar30._4_4_ * 0.0;
        auVar132._8_4_ = auVar30._8_4_ * 1.0;
        auVar132._12_4_ = auVar30._12_4_ * 0.0;
        auVar33 = vfmadd231ps_fma(auVar132,auVar70,auVar33);
        auVar30 = vfmadd231ps_fma(auVar33,auVar29,auVar124);
        auVar117._4_4_ = fVar82;
        auVar117._0_4_ = fVar82;
        auVar117._8_4_ = fVar82;
        auVar117._12_4_ = fVar82;
        auVar112._4_4_ = fVar110;
        auVar112._0_4_ = fVar110;
        auVar112._8_4_ = fVar110;
        auVar112._12_4_ = fVar110;
        fVar83 = auVar27._0_4_;
        auVar125._0_4_ = fVar83 * 0.0;
        auVar125._4_4_ = fVar83 * 0.0;
        auVar125._8_4_ = fVar83 * 1.0;
        auVar125._12_4_ = fVar83 * 0.0;
        auVar33 = vfmadd231ps_fma(auVar125,auVar70,auVar112);
        auVar33 = vfmadd231ps_fma(auVar33,auVar29,auVar117);
        auVar64._0_4_ = a0.field_0._0_4_;
        auVar64._4_4_ = auVar64._0_4_;
        auVar64._8_4_ = auVar64._0_4_;
        auVar64._12_4_ = auVar64._0_4_;
        fVar83 = auVar33._0_4_;
        auVar113._0_4_ = fVar83 * 0.0;
        fVar50 = auVar33._4_4_;
        auVar113._4_4_ = fVar50 * 0.0;
        fVar25 = auVar33._8_4_;
        auVar113._8_4_ = fVar25 * 0.0;
        fVar82 = auVar33._12_4_;
        auVar113._12_4_ = fVar82 * 0.0;
        auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar30,auVar113);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar33,auVar31,auVar64);
        uVar81 = auVar32._0_4_;
        auVar118._4_4_ = uVar81;
        auVar118._0_4_ = uVar81;
        auVar118._8_4_ = uVar81;
        auVar118._12_4_ = uVar81;
        auVar33 = vshufps_avx(auVar32,auVar32,0x55);
        auVar33 = vfmadd213ps_fma(auVar33,auVar30,auVar113);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar33,auVar31,auVar118);
        iVar69 = a0_1.field_0._0_4_;
        auVar99._4_4_ = iVar69;
        auVar99._0_4_ = iVar69;
        auVar99._8_4_ = iVar69;
        auVar99._12_4_ = iVar69;
        auVar33 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar32 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar74._0_4_ = fVar83 * auVar32._0_4_;
        auVar74._4_4_ = fVar50 * auVar32._4_4_;
        auVar74._8_4_ = fVar25 * auVar32._8_4_;
        auVar74._12_4_ = fVar82 * auVar32._12_4_;
        auVar33 = vfmadd231ps_fma(auVar74,auVar30,auVar33);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar33,auVar31,auVar99);
        uVar81 = auVar26._0_4_;
        auVar100._4_4_ = uVar81;
        auVar100._0_4_ = uVar81;
        auVar100._8_4_ = uVar81;
        auVar100._12_4_ = uVar81;
        auVar33 = vshufps_avx(auVar26,auVar26,0x55);
        auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
        auVar89._0_4_ = fVar83 * auVar26._0_4_;
        auVar89._4_4_ = fVar50 * auVar26._4_4_;
        auVar89._8_4_ = fVar25 * auVar26._8_4_;
        auVar89._12_4_ = fVar82 * auVar26._12_4_;
        auVar26 = vfmadd231ps_fma(auVar89,auVar30,auVar33);
        auVar33 = vfmadd231ps_fma(auVar26,auVar31,auVar100);
        auVar26._0_4_ = auVar28._0_4_ + 0.0 + auVar33._0_4_;
        auVar26._4_4_ = auVar28._4_4_ + 0.0 + auVar33._4_4_;
        auVar26._8_4_ = auVar28._8_4_ + 0.0 + auVar33._8_4_;
        auVar26._12_4_ = auVar28._12_4_ + 0.0 + auVar33._12_4_;
      }
      else if (iVar69 == 0x9134) {
        lVar4 = *plVar3;
        lVar18 = uVar17 * plVar3[2];
        auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar18)),
                                ZEXT416(*(uint *)(lVar4 + 0x10 + lVar18)),0x1c);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar18)),0x28);
        auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),
                                ZEXT416(*(uint *)(lVar4 + 0x14 + lVar18)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),0x28);
        auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),
                                ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar18)),0x28);
        auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar4 + 0x1c + lVar18)),0x1c);
        auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar18)),0x28);
      }
      else if (iVar69 == 0x9234) {
        lVar4 = *plVar3;
        lVar18 = uVar17 * plVar3[2];
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)(lVar4 + 4 + lVar18);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar18)),_DAT_01fefe80,auVar71);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),_DAT_01fefe80,
                                        auVar84);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),_DAT_01fefe80,
                                          auVar85);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar18);
        auVar26 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),_DAT_01fefe80,
                                     auVar101);
      }
      else if (iVar69 == 0xb001) {
        lVar4 = *plVar3;
        lVar18 = uVar17 * plVar3[2];
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
        auVar28 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),0x20);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar18);
        auVar33 = vpermt2ps_avx512vl(auVar52,_DAT_01fefe90,ZEXT416(*(uint *)(lVar4 + lVar18)));
        auVar102._8_8_ = 0;
        auVar102._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
        fVar83 = *(float *)(lVar4 + 0x24 + lVar18);
        fVar50 = *(float *)(lVar4 + 0x28 + lVar18);
        fVar25 = *(float *)(lVar4 + 0x2c + lVar18);
        auVar32 = vpermt2ps_avx512vl(auVar102,_DAT_01fefe90,
                                     ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)));
        fVar82 = *(float *)(lVar4 + 0x30 + lVar18);
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * fVar50)),ZEXT416((uint)fVar83),
                                  ZEXT416((uint)fVar83));
        auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
        auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
        auVar31 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar26._0_4_));
        fVar110 = auVar31._0_4_;
        fVar110 = fVar110 * 1.5 + fVar110 * fVar110 * fVar110 * auVar26._0_4_ * -0.5;
        auVar26 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar110 * fVar83)),0x30);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar33,ZEXT416((uint)(fVar110 * fVar50)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar28,ZEXT416((uint)(fVar110 * fVar82)),0x30);
        auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),0x10);
        auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar18)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar28,ZEXT416((uint)(fVar25 * fVar110)),0x30);
      }
      else if (iVar69 == 0x9244) {
        lVar4 = *plVar3;
        lVar18 = uVar17 * plVar3[2];
        a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + lVar18))->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x10 + lVar18))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x20 + lVar18))->
                        v;
        auVar26 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar18);
      }
    }
    else {
      fVar83 = (pGVar1->time_range).lower;
      fVar50 = (pGVar1->time_range).upper;
      auVar27 = ZEXT416((uint)fVar50);
      fVar83 = pGVar1->fnumTimeSegments *
               (((ray->dir).field_0.m128[3] - fVar83) / (fVar50 - fVar83));
      auVar26 = ZEXT416((uint)fVar83);
      auVar31 = vroundss_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83),9);
      auVar31 = vminss_avx(auVar31,ZEXT416((uint)(pGVar1->fnumTimeSegments + -1.0)));
      auVar30 = ZEXT816(0) << 0x20;
      auVar70 = SUB6416(ZEXT864(0),0) << 0x20;
      auVar31 = vmaxss_avx(auVar30,auVar31);
      fVar83 = fVar83 - auVar31._0_4_;
      iVar19 = (int)auVar31._0_4_;
      lVar4 = *(long *)&pGVar1[1].fnumTimeSegments;
      lVar18 = CONCAT44((int)((ulong)prim >> 0x20),iVar19) * 0x38;
      plVar3 = (long *)(lVar4 + lVar18);
      iVar69 = *(int *)(lVar4 + 0x20 + lVar18);
      if ((pGVar1->field_8).field_0x1 == '\x01') {
        auVar26 = ZEXT416((uint)fVar83);
        if (iVar69 == 0x9134) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          uVar49 = *(uint *)(lVar18 + 8 + lVar22);
          auVar70 = ZEXT416(uVar49);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x10 + lVar22)),0x1c);
          local_158 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x20 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x14 + lVar22)),0x1c);
          auStack_138 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x24 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(uVar49),ZEXT416(*(uint *)(lVar18 + 0x18 + lVar22)),0x1c);
          local_128 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x28 + lVar22)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x1c + lVar22)),0x1c);
          local_168 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x2c + lVar22)),0x28);
        }
        else if (iVar69 == 0x9234) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)(lVar18 + 4 + lVar22);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar22);
          local_158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + lVar22)),_DAT_01fefe80,auVar33);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + 0xc + lVar22)),_DAT_01fefe80,
                                       auVar32);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar22);
          local_128 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar22)),_DAT_01fefe80,
                                         auVar31);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(lVar18 + 0x28 + lVar22);
          auVar70 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + 0x24 + lVar22)),_DAT_01fefe80,
                                       auVar30);
          local_168 = auVar70;
          auStack_138 = auVar32;
        }
        else if (iVar69 == 0xb001) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar22);
          auVar33 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar18 + 8 + lVar22)),0x20);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(lVar18 + 0x34 + lVar22);
          uVar49 = *(uint *)(lVar18 + 0xc + lVar22);
          auVar32 = ZEXT416(uVar49);
          auVar31 = vpermt2ps_avx512vl(auVar27,_DAT_01fefe90,ZEXT416(*(uint *)(lVar18 + lVar22)));
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar22);
          fVar50 = *(float *)(lVar18 + 0x24 + lVar22);
          fVar25 = *(float *)(lVar18 + 0x28 + lVar22);
          fVar82 = *(float *)(lVar18 + 0x2c + lVar22);
          auVar30 = vpermt2ps_avx512vl(auVar70,_DAT_01fefe90,
                                       ZEXT416(*(uint *)(lVar18 + 0x18 + lVar22)));
          fVar110 = *(float *)(lVar18 + 0x30 + lVar22);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),ZEXT416((uint)fVar50),
                                    ZEXT416((uint)fVar50));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar110),ZEXT416((uint)fVar110));
          auVar27 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar28._0_4_));
          fVar115 = auVar27._0_4_;
          fVar115 = fVar115 * 1.5 + fVar115 * fVar115 * fVar115 * auVar28._0_4_ * -0.5;
          auVar28 = ZEXT416((uint)(fVar50 * fVar115));
          local_168 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar50 * fVar115)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar25 * fVar115));
          local_158 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar25 * fVar115)),0x30);
          auVar70 = ZEXT416((uint)(fVar110 * fVar115));
          local_128 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar110 * fVar115)),0x30);
          auVar33 = vinsertps_avx(ZEXT416(uVar49),ZEXT416(*(uint *)(lVar18 + 4 + lVar22)),0x10);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x3c + lVar22)),0x20);
          auStack_138 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar82 * fVar115)),0x30);
        }
        else if (iVar69 == 0x9244) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          local_158 = *(undefined1 (*) [16])(lVar18 + lVar22);
          auStack_138 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar22);
          local_128 = *(undefined1 (*) [16])(lVar18 + 0x20 + lVar22);
          local_168 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar22);
        }
        lVar18 = (ulong)(iVar19 + 1) * 0x38;
        plVar3 = (long *)(lVar4 + lVar18);
        iVar69 = *(int *)(lVar4 + 0x20 + lVar18);
        if (iVar69 == 0x9134) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x10 + lVar18)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar18)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x14 + lVar18)),0x1c);
          auVar32 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),0x1c);
          auVar70 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar18)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x1c + lVar18)),0x1c);
          auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar18)),0x28);
        }
        else if (iVar69 == 0x9234) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(lVar4 + 4 + lVar18);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar18)),_DAT_01fefe80,auVar29);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),_DAT_01fefe80,
                                       auVar75);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
          auVar70 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),_DAT_01fefe80,
                                       auVar34);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar18);
          auVar28 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),_DAT_01fefe80,
                                       auVar35);
        }
        else if (iVar69 == 0xb001) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
          auVar33 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),0x20);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar18);
          auVar32 = vpermt2ps_avx512vl(auVar43,_DAT_01fefe90,ZEXT416(*(uint *)(lVar4 + lVar18)));
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
          fVar50 = *(float *)(lVar4 + 0x24 + lVar18);
          fVar25 = *(float *)(lVar4 + 0x28 + lVar18);
          fVar82 = *(float *)(lVar4 + 0x2c + lVar18);
          auVar31 = vpermt2ps_avx512vl(auVar44,_DAT_01fefe90,
                                       ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)));
          fVar110 = *(float *)(lVar4 + 0x30 + lVar18);
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),ZEXT416((uint)fVar50),
                                    ZEXT416((uint)fVar50));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar110),ZEXT416((uint)fVar110));
          auVar131._4_12_ = ZEXT812(0) << 0x20;
          auVar131._0_4_ = auVar28._0_4_;
          auVar30 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar131);
          fVar115 = auVar30._0_4_;
          fVar115 = fVar115 * 1.5 + fVar115 * fVar115 * fVar115 * auVar28._0_4_ * -0.5;
          auVar28 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar50 * fVar115)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar32,ZEXT416((uint)(fVar25 * fVar115)),0x30);
          auVar70 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar110 * fVar115)),0x30);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),0x10);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar18)),0x20);
          auVar32 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar82 * fVar115)),0x30);
        }
        else if (iVar69 == 0x9244) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + lVar18))->v;
          auVar32 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar18);
          auVar70 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar18);
          auVar28 = *(undefined1 (*) [16])(lVar4 + 0x30 + lVar18);
        }
        auVar29 = vpermilps_avx(local_168,0xff);
        auVar34 = vpermilps_avx(local_158,0xff);
        auVar35 = vpermilps_avx(auStack_138,0xff);
        auVar75 = vpermilps_avx(local_128,0xff);
        auVar33 = vshufps_avx(auVar28,auVar28,0xff);
        auVar31 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
        auVar30 = vshufps_avx(auVar32,auVar32,0xff);
        auVar27 = vshufps_avx(auVar70,auVar70,0xff);
        fVar50 = auVar31._0_4_;
        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * auVar34._0_4_)),auVar33,auVar29);
        auVar42 = vfmadd231ss_fma(auVar42,auVar30,auVar35);
        auVar42 = vfmadd231ss_fma(auVar42,auVar27,auVar75);
        auVar65._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
        auVar65._8_4_ = auVar42._8_4_ ^ 0x80000000;
        auVar65._12_4_ = auVar42._12_4_ ^ 0x80000000;
        bVar16 = auVar42._0_4_ < -auVar42._0_4_;
        auVar36._4_12_ = auVar33._4_12_;
        auVar36._0_4_ = (uint)bVar16 * (auVar33._0_4_ ^ 0x80000000) + (uint)!bVar16 * auVar33._0_4_;
        auVar37._4_12_ = auVar31._4_12_;
        auVar37._0_4_ = (uint)bVar16 * (int)-fVar50 + (uint)!bVar16 * (int)fVar50;
        auVar38._4_12_ = auVar30._4_12_;
        auVar38._0_4_ = (uint)bVar16 * (auVar30._0_4_ ^ 0x80000000) + (uint)!bVar16 * auVar30._0_4_;
        auVar39._4_12_ = auVar27._4_12_;
        auVar39._0_4_ = (uint)bVar16 * (auVar27._0_4_ ^ 0x80000000) + (uint)!bVar16 * auVar27._0_4_;
        auVar15._8_4_ = 0x7fffffff;
        auVar15._0_8_ = 0x7fffffff7fffffff;
        auVar15._12_4_ = 0x7fffffff;
        auVar30 = vandps_avx512vl(auVar42,auVar15);
        auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar30,ZEXT416(0x3c9df1b8));
        auVar33 = vfmadd213ss_fma(auVar33,auVar30,ZEXT416(0xbd37e81c));
        auVar33 = vfmadd213ss_fma(auVar33,auVar30,ZEXT416(0x3db3edac));
        auVar33 = vfmadd213ss_fma(auVar33,auVar30,ZEXT416(0xbe5ba881));
        auVar31 = vfmadd213ss_fma(auVar33,auVar30,ZEXT416(0x3fc90fd1));
        auVar33 = vmaxss_avx(auVar65,auVar42);
        uVar49 = auVar33._0_4_;
        fVar50 = 1.0 - auVar30._0_4_;
        if (fVar50 < 0.0) {
          fVar50 = sqrtf(fVar50);
        }
        else {
          auVar33 = vsqrtss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
          fVar50 = auVar33._0_4_;
        }
        auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar50 * auVar31._0_4_)))
        ;
        auVar27 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar31 = vxorps_avx512vl(auVar33,auVar27);
        uVar6 = vcmpss_avx512f(ZEXT416(uVar49),ZEXT816(0) << 0x40,1);
        bVar16 = (bool)((byte)uVar6 & 1);
        uVar6 = vcmpss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)auVar30._0_4_),1);
        bVar8 = (bool)((byte)uVar6 & 1);
        fVar50 = fVar83 * (float)((uint)bVar8 * 0x7fc00000 +
                                 (uint)!bVar8 *
                                 (int)(1.5707964 -
                                      (float)((uint)bVar16 * auVar31._0_4_ +
                                             (uint)!bVar16 * auVar33._0_4_)));
        auVar33 = ZEXT416((uint)(fVar50 * 0.63661975));
        auVar33 = vroundss_avx(auVar33,auVar33,9);
        auVar31 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar33,ZEXT416((uint)fVar50));
        uVar20 = (int)auVar33._0_4_ & 3;
        uVar21 = uVar20 - 1;
        fVar25 = auVar31._0_4_;
        fVar50 = fVar25 * fVar25;
        auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar50),
                                  ZEXT416(0x363938a8));
        auVar30 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar50),
                                  ZEXT416(0x37cfab9c));
        auVar42 = ZEXT416((uint)fVar50);
        auVar31 = vfmadd213ss_fma(auVar31,auVar42,ZEXT416(0xb9501096));
        auVar30 = vfmadd213ss_fma(auVar30,auVar42,ZEXT416(0xbab60981));
        auVar31 = vfmadd213ss_fma(auVar31,auVar42,ZEXT416(0x3c088898));
        auVar30 = vfmadd213ss_fma(auVar30,auVar42,ZEXT416(0x3d2aaaa4));
        auVar42 = ZEXT416((uint)fVar50);
        auVar31 = vfmadd213ss_fma(auVar31,auVar42,ZEXT416(0xbe2aaaab));
        auVar30 = vfmadd213ss_fma(auVar30,auVar42,SUB6416(ZEXT464(0xbf000000),0));
        auVar31 = vfmadd213ss_avx512f(auVar31,auVar42,ZEXT416(0x3f800000));
        auVar30 = vfmadd213ss_avx512f(auVar30,auVar42,ZEXT416(0x3f800000));
        fVar25 = fVar25 * auVar31._0_4_;
        bVar7 = (byte)(int)auVar33._0_4_;
        uVar24 = (uint)(bVar7 & 1) * auVar30._0_4_ + (uint)!(bool)(bVar7 & 1) * (int)fVar25;
        auVar40._4_12_ = auVar30._4_12_;
        auVar40._0_4_ = (uint)(bVar7 & 1) * (int)fVar25 + (uint)!(bool)(bVar7 & 1) * auVar30._0_4_;
        auVar33 = vxorps_avx512vl(auVar40,auVar27);
        auVar41._0_4_ = (uint)(uVar21 < 2) * auVar33._0_4_ + (uint)(uVar21 >= 2) * auVar40._0_4_;
        auVar41._4_12_ = auVar40._4_12_;
        auVar31 = vfmsub213ss_avx512f(auVar29,ZEXT416(uVar49),auVar36);
        auVar42 = ZEXT416(uVar49);
        auVar33 = vfmsub213ss_avx512f(auVar34,auVar42,auVar37);
        auVar30 = vfmsub213ss_avx512f(auVar35,auVar42,auVar38);
        auVar42 = vfmsub213ss_avx512f(auVar75,auVar42,auVar39);
        fVar82 = auVar33._0_4_;
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar82 * fVar82)),auVar31,auVar31);
        auVar33 = vfmadd231ss_fma(auVar33,auVar30,auVar30);
        auVar33 = vfmadd231ss_fma(auVar33,auVar42,auVar42);
        auVar60._12_4_ = 0;
        auVar60._0_12_ = ZEXT812(0);
        auVar60 = auVar60 << 0x20;
        auVar43 = vrsqrt14ss_avx512f(auVar60,ZEXT416((uint)auVar33._0_4_));
        fVar50 = auVar43._0_4_;
        fVar50 = fVar50 * 1.5 + fVar50 * fVar50 * fVar50 * auVar33._0_4_ * -0.5;
        auVar33 = vxorps_avx512vl(ZEXT416(uVar24),auVar27);
        fVar25 = (float)((1 < uVar20) * uVar24 + (uint)(1 >= uVar20) * auVar33._0_4_);
        auVar43 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar25 * fVar50 * auVar31._0_4_)),auVar41,
                                      auVar29);
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar50 * fVar82)),auVar41,auVar34);
        auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar50 * auVar30._0_4_ * fVar25)),auVar41,auVar35);
        auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar50 * auVar42._0_4_)),auVar75,auVar41);
        auVar42 = vsubss_avx512f(ZEXT416(0x3f800000),auVar26);
        auVar27 = vmulss_avx512f(auVar26,auVar36);
        auVar44 = vfmadd231ss_avx512f(auVar27,auVar42,auVar29);
        auVar27 = vmulss_avx512f(auVar26,auVar37);
        auVar27 = vfmadd231ss_fma(auVar27,auVar42,auVar34);
        auVar29 = vmulss_avx512f(auVar26,auVar38);
        auVar29 = vfmadd231ss_fma(auVar29,auVar42,auVar35);
        auVar26 = vmulss_avx512f(auVar26,auVar39);
        auVar26 = vfmadd231ss_fma(auVar26,auVar42,auVar75);
        fVar25 = auVar27._0_4_;
        auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),auVar44,auVar44);
        auVar27 = vfmadd231ss_fma(auVar27,auVar29,auVar29);
        auVar27 = vfmadd231ss_fma(auVar27,auVar26,auVar26);
        auVar34 = vrsqrt14ss_avx512f(auVar60,ZEXT416((uint)auVar27._0_4_));
        fVar50 = auVar34._0_4_;
        fVar50 = fVar50 * 1.5 + fVar50 * fVar50 * fVar50 * auVar27._0_4_ * -0.5;
        vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
        bVar16 = 2 < uVar21;
        auVar45._4_12_ = auVar43._4_12_;
        auVar45._0_4_ =
             (float)((uint)bVar16 * (int)(auVar44._0_4_ * fVar50) + (uint)!bVar16 * auVar43._0_4_);
        auVar46._4_12_ = auVar33._4_12_;
        auVar46._0_4_ =
             (float)((uint)bVar16 * (int)(fVar25 * fVar50) + (uint)!bVar16 * auVar33._0_4_);
        auVar47._4_12_ = auVar31._4_12_;
        auVar47._0_4_ =
             (float)((uint)bVar16 * (int)(auVar29._0_4_ * fVar50) + (uint)!bVar16 * auVar31._0_4_);
        auVar48._4_12_ = auVar30._4_12_;
        auVar48._0_4_ =
             (float)((uint)bVar16 * (int)(auVar26._0_4_ * fVar50) + (uint)!bVar16 * auVar30._0_4_);
        local_58 = b0.field_0._0_4_;
        fStack_54 = b0.field_0._4_4_;
        fStack_50 = b0.field_0._8_4_;
        fStack_4c = b0.field_0._12_4_;
        auVar119._0_4_ = fVar83 * local_58;
        auVar119._4_4_ = fVar83 * fStack_54;
        auVar119._8_4_ = fVar83 * fStack_50;
        auVar119._12_4_ = fVar83 * fStack_4c;
        auVar114._0_4_ = auVar42._0_4_;
        auVar114._4_4_ = auVar114._0_4_;
        auVar114._8_4_ = auVar114._0_4_;
        auVar114._12_4_ = auVar114._0_4_;
        auVar29 = vfmadd213ps_avx512vl(local_158,auVar114,auVar119);
        local_68 = auVar32._0_4_;
        fStack_64 = auVar32._4_4_;
        fStack_60 = auVar32._8_4_;
        fStack_5c = auVar32._12_4_;
        auVar120._0_4_ = fVar83 * local_68;
        auVar120._4_4_ = fVar83 * fStack_64;
        auVar120._8_4_ = fVar83 * fStack_60;
        auVar120._12_4_ = fVar83 * fStack_5c;
        auVar26 = vfmadd213ps_fma(auStack_138,auVar114,auVar120);
        local_78 = auVar70._0_4_;
        fStack_74 = auVar70._4_4_;
        fStack_70 = auVar70._8_4_;
        fStack_6c = auVar70._12_4_;
        auVar121._0_4_ = fVar83 * local_78;
        auVar121._4_4_ = fVar83 * fStack_74;
        auVar121._8_4_ = fVar83 * fStack_70;
        auVar121._12_4_ = fVar83 * fStack_6c;
        auVar34 = vfmadd213ps_avx512vl(local_128,auVar114,auVar121);
        local_88 = auVar28._0_4_;
        fStack_84 = auVar28._4_4_;
        fStack_80 = auVar28._8_4_;
        fStack_7c = auVar28._12_4_;
        auVar107._0_4_ = fVar83 * local_88;
        auVar107._4_4_ = fVar83 * fStack_84;
        auVar107._8_4_ = fVar83 * fStack_80;
        auVar107._12_4_ = fVar83 * fStack_7c;
        auVar33 = vfmadd213ps_fma(local_168,auVar114,auVar107);
        auVar28 = vshufps_avx512vl(auVar29,auVar60,0xe9);
        auVar28 = vblendps_avx(auVar28,auVar26,4);
        auVar32 = vfmadd213ss_fma(auVar45,auVar45,ZEXT416((uint)(auVar46._0_4_ * auVar46._0_4_)));
        auVar32 = vfnmadd231ss_fma(auVar32,auVar47,auVar47);
        auVar30 = vfnmadd231ss_fma(auVar32,auVar48,auVar48);
        auVar32 = vfmadd213ss_fma(auVar47,auVar46,ZEXT416((uint)(auVar45._0_4_ * auVar48._0_4_)));
        fVar83 = auVar32._0_4_ + auVar32._0_4_;
        auVar32 = vfmsub213ss_fma(auVar48,auVar46,ZEXT416((uint)(auVar45._0_4_ * auVar47._0_4_)));
        fVar50 = auVar32._0_4_ + auVar32._0_4_;
        auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar45._0_4_ * auVar48._0_4_)),auVar46,auVar47);
        fVar25 = auVar32._0_4_ + auVar32._0_4_;
        auVar31 = vfmsub231ss_fma(ZEXT416((uint)(auVar46._0_4_ * auVar46._0_4_)),auVar45,auVar45);
        auVar32 = vfmadd213ss_fma(auVar47,auVar47,auVar31);
        auVar70 = vfnmadd231ss_fma(auVar32,auVar48,auVar48);
        auVar32 = vfmadd213ss_fma(auVar48,auVar47,ZEXT416((uint)(auVar45._0_4_ * auVar46._0_4_)));
        fVar82 = auVar32._0_4_ + auVar32._0_4_;
        auVar32 = vfmadd213ss_fma(auVar46,auVar48,ZEXT416((uint)(auVar45._0_4_ * auVar47._0_4_)));
        fVar110 = auVar32._0_4_ + auVar32._0_4_;
        auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar45._0_4_ * auVar46._0_4_)),auVar47,auVar48);
        fVar115 = auVar32._0_4_ + auVar32._0_4_;
        auVar32 = vfnmadd231ss_fma(auVar31,auVar47,auVar47);
        auVar27 = vfmadd231ss_fma(auVar32,auVar48,auVar48);
        uVar81 = auVar30._0_4_;
        auVar66._4_4_ = uVar81;
        auVar66._0_4_ = uVar81;
        auVar66._8_4_ = uVar81;
        auVar66._12_4_ = uVar81;
        auVar76._4_4_ = fVar83;
        auVar76._0_4_ = fVar83;
        auVar76._8_4_ = fVar83;
        auVar76._12_4_ = fVar83;
        auVar130._0_4_ = fVar50 * 0.0;
        auVar130._4_4_ = fVar50 * 0.0;
        auVar130._8_4_ = fVar50 * 1.0;
        auVar130._12_4_ = fVar50 * 0.0;
        auVar35 = ZEXT816(0x3f80000000000000);
        auVar32 = vfmadd231ps_fma(auVar130,auVar35,auVar76);
        auVar75 = SUB6416(ZEXT464(0x3f800000),0);
        auVar31 = vfmadd231ps_fma(auVar32,auVar75,auVar66);
        auVar67._4_4_ = fVar25;
        auVar67._0_4_ = fVar25;
        auVar67._8_4_ = fVar25;
        auVar67._12_4_ = fVar25;
        uVar81 = auVar70._0_4_;
        auVar77._4_4_ = uVar81;
        auVar77._0_4_ = uVar81;
        auVar77._8_4_ = uVar81;
        auVar77._12_4_ = uVar81;
        auVar126._0_4_ = fVar82 * 0.0;
        auVar126._4_4_ = fVar82 * 0.0;
        auVar126._8_4_ = fVar82 * 1.0;
        auVar126._12_4_ = fVar82 * 0.0;
        auVar32 = vfmadd231ps_fma(auVar126,auVar35,auVar77);
        auVar30 = vfmadd231ps_fma(auVar32,auVar75,auVar67);
        auVar68._4_4_ = fVar110;
        auVar68._0_4_ = fVar110;
        auVar68._8_4_ = fVar110;
        auVar68._12_4_ = fVar110;
        auVar78._4_4_ = fVar115;
        auVar78._0_4_ = fVar115;
        auVar78._8_4_ = fVar115;
        auVar78._12_4_ = fVar115;
        fVar83 = auVar27._0_4_;
        auVar90._0_4_ = fVar83 * 0.0;
        auVar90._4_4_ = fVar83 * 0.0;
        auVar90._8_4_ = fVar83 * 1.0;
        auVar90._12_4_ = fVar83 * 0.0;
        auVar32 = vfmadd231ps_fma(auVar90,auVar35,auVar78);
        auVar32 = vfmadd231ps_fma(auVar32,auVar75,auVar68);
        auVar27 = vbroadcastss_avx512vl(auVar29);
        fVar83 = auVar32._0_4_;
        auVar79._0_4_ = fVar83 * 0.0;
        fVar50 = auVar32._4_4_;
        auVar79._4_4_ = fVar50 * 0.0;
        fVar25 = auVar32._8_4_;
        auVar79._8_4_ = fVar25 * 0.0;
        fVar82 = auVar32._12_4_;
        auVar79._12_4_ = fVar82 * 0.0;
        auVar32 = vfmadd213ps_fma(auVar60,auVar30,auVar79);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar32,auVar31,auVar27);
        uVar81 = auVar26._0_4_;
        auVar108._4_4_ = uVar81;
        auVar108._0_4_ = uVar81;
        auVar108._8_4_ = uVar81;
        auVar108._12_4_ = uVar81;
        auVar26 = vshufps_avx(auVar26,auVar26,0x55);
        auVar26 = vfmadd213ps_fma(auVar26,auVar30,auVar79);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar26,auVar31,auVar108);
        auVar32 = vbroadcastss_avx512vl(auVar34);
        auVar26 = vshufps_avx512vl(auVar34,auVar34,0x55);
        auVar27 = vshufps_avx512vl(auVar34,auVar34,0xaa);
        auVar80._0_4_ = auVar27._0_4_ * fVar83;
        auVar80._4_4_ = auVar27._4_4_ * fVar50;
        auVar80._8_4_ = auVar27._8_4_ * fVar25;
        auVar80._12_4_ = auVar27._12_4_ * fVar82;
        auVar26 = vfmadd231ps_fma(auVar80,auVar30,auVar26);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar26,auVar31,auVar32);
        uVar81 = auVar33._0_4_;
        auVar109._4_4_ = uVar81;
        auVar109._0_4_ = uVar81;
        auVar109._8_4_ = uVar81;
        auVar109._12_4_ = uVar81;
        auVar26 = vshufps_avx(auVar33,auVar33,0x55);
        auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
        auVar91._0_4_ = auVar33._0_4_ * fVar83;
        auVar91._4_4_ = auVar33._4_4_ * fVar50;
        auVar91._8_4_ = auVar33._8_4_ * fVar25;
        auVar91._12_4_ = auVar33._12_4_ * fVar82;
        auVar26 = vfmadd231ps_fma(auVar91,auVar30,auVar26);
        auVar33 = vfmadd231ps_fma(auVar26,auVar31,auVar109);
        auVar26._0_4_ = auVar28._0_4_ + 0.0 + auVar33._0_4_;
        auVar26._4_4_ = auVar28._4_4_ + 0.0 + auVar33._4_4_;
        auVar26._8_4_ = auVar28._8_4_ + 0.0 + auVar33._8_4_;
        auVar26._12_4_ = auVar28._12_4_ + 0.0 + auVar33._12_4_;
      }
      else {
        if (iVar69 == 0x9134) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x10 + lVar22)),0x1c);
          auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar18 + 0x20 + lVar22)),0x28);
          auVar31 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x14 + lVar22)),0x1c);
          auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar18 + 0x24 + lVar22)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x18 + lVar22)),0x1c);
          auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar18 + 0x28 + lVar22)),0x28);
          auVar27 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar18 + 0x1c + lVar22)),0x1c);
          auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar18 + 0x2c + lVar22)),0x28);
        }
        else if (iVar69 == 0x9234) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)(lVar18 + 4 + lVar22);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar22);
          auVar26 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + lVar22)),_DAT_01fefe80,auVar72);
          auVar31 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + 0xc + lVar22)),_DAT_01fefe80,
                                       auVar86);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar22);
          auVar30 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar22)),_DAT_01fefe80,
                                       auVar87);
          b0.field_0._8_8_ = 0;
          b0.field_0._0_8_ = *(ulong *)(lVar18 + 0x28 + lVar22);
          auVar27 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar18 + 0x24 + lVar22)),_DAT_01fefe80,
                                       (undefined1  [16])b0.field_0);
          auVar32 = _DAT_01fefe80;
        }
        else if (iVar69 == 0xb001) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar22);
          auVar32 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(lVar18 + 8 + lVar22)),0x20);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(lVar18 + 0x34 + lVar22);
          uVar49 = *(uint *)(lVar18 + 0xc + lVar22);
          auVar31 = vpermt2ps_avx512vl(auVar54,_DAT_01fefe90,ZEXT416(*(uint *)(lVar18 + lVar22)));
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar22);
          fVar50 = *(float *)(lVar18 + 0x24 + lVar22);
          auVar28 = ZEXT416((uint)fVar50);
          fVar25 = *(float *)(lVar18 + 0x28 + lVar22);
          auVar33 = ZEXT416((uint)fVar25);
          fVar82 = *(float *)(lVar18 + 0x2c + lVar22);
          auVar30 = vpermt2ps_avx512vl(auVar103,_DAT_01fefe90,
                                       ZEXT416(*(uint *)(lVar18 + 0x18 + lVar22)));
          fVar110 = *(float *)(lVar18 + 0x30 + lVar22);
          auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),ZEXT416((uint)fVar50),
                                    ZEXT416((uint)fVar50));
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar110),ZEXT416((uint)fVar110));
          auVar27 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar26._0_4_));
          fVar115 = auVar27._0_4_;
          fVar115 = fVar115 * 1.5 + fVar115 * fVar115 * fVar115 * auVar26._0_4_ * -0.5;
          auVar27 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar115 * fVar50)),0x30);
          auVar26 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar115 * fVar25)),0x30);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar82 * fVar115));
          auVar30 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar115 * fVar110)),0x30);
          auVar32 = vinsertps_avx(ZEXT416(uVar49),ZEXT416(*(uint *)(lVar18 + 4 + lVar22)),0x10);
          auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(lVar18 + 0x3c + lVar22)),0x20);
          auVar31 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar82 * fVar115)),0x30);
          auVar32 = ZEXT416(uVar49);
        }
        else if (iVar69 == 0x9244) {
          lVar18 = *plVar3;
          lVar22 = plVar3[2] * uVar17;
          auVar26 = *(undefined1 (*) [16])(lVar18 + lVar22);
          auVar31 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar22);
          auVar30 = *(undefined1 (*) [16])(lVar18 + 0x20 + lVar22);
          auVar27 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar22);
        }
        lVar18 = (ulong)(iVar19 + 1) * 0x38;
        plVar3 = (long *)(lVar4 + lVar18);
        iVar69 = *(int *)(lVar4 + 0x20 + lVar18);
        if (iVar69 == 0x9134) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x10 + lVar18)),0x1c);
          auVar32 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x20 + lVar18)),0x28);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x14 + lVar18)),0x1c);
          auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),0x28);
          auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),0x1c);
          auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar4 + 0x28 + lVar18)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 0x1c + lVar18)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar4 + 0x2c + lVar18)),0x28);
        }
        else if (iVar69 == 0x9234) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar104._8_8_ = 0;
          auVar104._0_8_ = *(ulong *)(lVar4 + 4 + lVar18);
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
          auVar32 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + lVar18)),_DAT_01fefe80,auVar104);
          auVar28 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),_DAT_01fefe80,
                                       auVar116);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
          auVar33 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)),_DAT_01fefe80,
                                       auVar105);
          auVar127._8_8_ = 0;
          auVar127._0_8_ = *(ulong *)(lVar4 + 0x28 + lVar18);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar4 + 0x24 + lVar18)),_DAT_01fefe80,
                                          auVar127);
        }
        else if (iVar69 == 0xb001) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)(lVar4 + 0x10 + lVar18);
          auVar28 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar4 + 8 + lVar18)),0x20);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(lVar4 + 0x34 + lVar18);
          auVar32 = vpermt2ps_avx512vl(auVar93,_DAT_01fefe90,ZEXT416(*(uint *)(lVar4 + lVar18)));
          auVar128._8_8_ = 0;
          auVar128._0_8_ = *(ulong *)(lVar4 + 0x1c + lVar18);
          fVar50 = *(float *)(lVar4 + 0x24 + lVar18);
          fVar25 = *(float *)(lVar4 + 0x28 + lVar18);
          fVar82 = *(float *)(lVar4 + 0x2c + lVar18);
          auVar70 = vpermt2ps_avx512vl(auVar128,_DAT_01fefe90,
                                       ZEXT416(*(uint *)(lVar4 + 0x18 + lVar18)));
          fVar110 = *(float *)(lVar4 + 0x30 + lVar18);
          auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),ZEXT416((uint)fVar50),
                                    ZEXT416((uint)fVar50));
          auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
          auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar110),ZEXT416((uint)fVar110));
          auVar134._4_12_ = ZEXT812(0) << 0x20;
          auVar134._0_4_ = auVar33._0_4_;
          auVar29 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar134);
          fVar115 = auVar29._0_4_;
          fVar115 = fVar115 * 1.5 + fVar115 * fVar115 * fVar115 * auVar33._0_4_ * -0.5;
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar70,ZEXT416((uint)(fVar50 * fVar115)),0x30);
          auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar25 * fVar115)),0x30);
          auVar33 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar115 * fVar110)),0x30);
          auVar28 = vinsertps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar4 + 4 + lVar18)),0x10);
          auVar28 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar4 + 0x3c + lVar18)),0x20);
          auVar28 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar82 * fVar115)),0x30);
        }
        else if (iVar69 == 0x9244) {
          lVar4 = *plVar3;
          lVar18 = uVar17 * plVar3[2];
          auVar32 = *(undefined1 (*) [16])(lVar4 + lVar18);
          auVar28 = *(undefined1 (*) [16])(lVar4 + 0x10 + lVar18);
          auVar33 = *(undefined1 (*) [16])(lVar4 + 0x20 + lVar18);
          b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar4 + 0x30 + lVar18))->
                        v;
        }
        fVar50 = 1.0 - fVar83;
        auVar94._0_4_ = fVar83 * auVar32._0_4_;
        auVar94._4_4_ = fVar83 * auVar32._4_4_;
        auVar94._8_4_ = fVar83 * auVar32._8_4_;
        auVar94._12_4_ = fVar83 * auVar32._12_4_;
        auVar122._4_4_ = fVar50;
        auVar122._0_4_ = fVar50;
        auVar122._8_4_ = fVar50;
        auVar122._12_4_ = fVar50;
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd213ps_fma(auVar26,auVar122,auVar94);
        auVar95._0_4_ = fVar83 * auVar28._0_4_;
        auVar95._4_4_ = fVar83 * auVar28._4_4_;
        auVar95._8_4_ = fVar83 * auVar28._8_4_;
        auVar95._12_4_ = fVar83 * auVar28._12_4_;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar31,auVar122,auVar95);
        auVar96._0_4_ = fVar83 * auVar33._0_4_;
        auVar96._4_4_ = fVar83 * auVar33._4_4_;
        auVar96._8_4_ = fVar83 * auVar33._8_4_;
        auVar96._12_4_ = fVar83 * auVar33._12_4_;
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd213ps_fma(auVar30,auVar122,auVar96);
        auVar97._0_4_ = fVar83 * b0.field_0._0_4_;
        auVar97._4_4_ = fVar83 * b0.field_0._4_4_;
        auVar97._8_4_ = fVar83 * b0.field_0._8_4_;
        auVar97._12_4_ = fVar83 * b0.field_0._12_4_;
        auVar26 = vfmadd213ps_fma(auVar27,auVar122,auVar97);
      }
    }
    auVar28 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar33 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar111._0_4_ = a0_1.field_0._0_4_ * auVar33._0_4_;
    auVar111._4_4_ = a0_1.field_0._4_4_ * auVar33._4_4_;
    auVar111._8_4_ = a0_1.field_0._8_4_ * auVar33._8_4_;
    auVar111._12_4_ = a0_1.field_0._12_4_ * auVar33._12_4_;
    auVar30 = vfmsub231ps_fma(auVar111,(undefined1  [16])a0.field_0,auVar28);
    auVar32 = vshufps_avx(auVar30,auVar30,0xc9);
    auVar31 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
    auVar98._0_4_ = a0_2.field_0._0_4_ * auVar28._0_4_;
    auVar98._4_4_ = a0_2.field_0._4_4_ * auVar28._4_4_;
    auVar98._8_4_ = a0_2.field_0._8_4_ * auVar28._8_4_;
    auVar98._12_4_ = a0_2.field_0._12_4_ * auVar28._12_4_;
    auVar27 = vfmsub231ps_fma(auVar98,auVar31,(undefined1  [16])a0_1.field_0);
    auVar61._0_4_ = auVar31._0_4_ * a0.field_0._0_4_;
    auVar61._4_4_ = auVar31._4_4_ * a0.field_0._4_4_;
    auVar61._8_4_ = auVar31._8_4_ * a0.field_0._8_4_;
    auVar61._12_4_ = auVar31._12_4_ * a0.field_0._12_4_;
    auVar33 = vfmsub231ps_fma(auVar61,(undefined1  [16])a0_2.field_0,auVar33);
    auVar28 = vshufps_avx(auVar33,auVar33,0xc9);
    auVar31 = vunpcklps_avx(auVar32,auVar28);
    auVar28 = vunpcklps_avx(auVar30,auVar33);
    auVar33 = vinsertps_avx(auVar27,auVar27,0x4a);
    auVar30 = vunpcklps_avx(auVar28,ZEXT416(auVar27._0_4_));
    auVar28 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar32,0x7f);
    auVar27 = vunpcklps_avx(auVar31,auVar33);
    auVar32 = vunpckhps_avx(auVar31,auVar33);
    auVar55._0_4_ = auVar28._0_4_;
    auVar55._4_4_ = auVar55._0_4_;
    auVar55._8_4_ = auVar55._0_4_;
    auVar55._12_4_ = auVar55._0_4_;
    auVar33 = vdivps_avx(auVar27,auVar55);
    auVar32 = vdivps_avx(auVar32,auVar55);
    auVar31 = vdivps_avx(auVar30,auVar55);
    uVar81 = auVar26._0_4_;
    auVar62._4_4_ = uVar81;
    auVar62._0_4_ = uVar81;
    auVar62._8_4_ = uVar81;
    auVar62._12_4_ = uVar81;
    auVar28 = vshufps_avx(auVar26,auVar26,0x55);
    auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
    auVar88._0_4_ = auVar26._0_4_ * auVar31._0_4_;
    auVar88._4_4_ = auVar26._4_4_ * auVar31._4_4_;
    auVar88._8_4_ = auVar26._8_4_ * auVar31._8_4_;
    auVar88._12_4_ = auVar26._12_4_ * auVar31._12_4_;
    auVar26 = vfmadd231ps_fma(auVar88,auVar32,auVar28);
    auVar30 = vfmadd231ps_fma(auVar26,auVar33,auVar62);
    auVar26 = *(undefined1 (*) [16])(ray->org).field_0.m128;
    auVar28 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
    uVar81 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar9._4_4_ = uVar81;
    auVar9._0_4_ = uVar81;
    auVar9._8_4_ = uVar81;
    auVar9._12_4_ = uVar81;
    auVar30 = vfmsub231ps_avx512vl(auVar30,auVar31,auVar9);
    uVar81 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar10._4_4_ = uVar81;
    auVar10._0_4_ = uVar81;
    auVar10._8_4_ = uVar81;
    auVar10._12_4_ = uVar81;
    auVar30 = vfmadd231ps_avx512vl(auVar30,auVar32,auVar10);
    uVar81 = *(undefined4 *)&(ray->org).field_0;
    auVar11._4_4_ = uVar81;
    auVar11._0_4_ = uVar81;
    auVar11._8_4_ = uVar81;
    auVar11._12_4_ = uVar81;
    auVar30 = vfmadd231ps_avx512vl(auVar30,auVar33,auVar11);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar30,auVar26,8);
    (ray->org).field_0 = aVar5;
    uVar81 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
    auVar12._4_4_ = uVar81;
    auVar12._0_4_ = uVar81;
    auVar12._8_4_ = uVar81;
    auVar12._12_4_ = uVar81;
    auVar31 = vmulps_avx512vl(auVar31,auVar12);
    uVar81 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
    auVar13._4_4_ = uVar81;
    auVar13._0_4_ = uVar81;
    auVar13._8_4_ = uVar81;
    auVar13._12_4_ = uVar81;
    auVar32 = vfmadd231ps_avx512vl(auVar31,auVar32,auVar13);
    uVar81 = *(undefined4 *)&(ray->dir).field_0;
    auVar14._4_4_ = uVar81;
    auVar14._0_4_ = uVar81;
    auVar14._8_4_ = uVar81;
    auVar14._12_4_ = uVar81;
    auVar33 = vfmadd231ps_avx512vl(auVar32,auVar33,auVar14);
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar33,auVar28,8);
    (ray->dir).field_0 = aVar5;
    (**(code **)(p_Var23 + 0x80))(p_Var23 + 0x58,ray);
    local_158._0_8_ = auVar26._0_8_;
    local_158._8_8_ = auVar26._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_158._0_8_;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = local_158._8_8_;
    local_168._0_8_ = auVar28._0_8_;
    local_168._8_8_ = auVar28._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_168._0_8_;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = local_168._8_8_;
    bVar16 = ray->tfar < 0.0;
    pRVar2->instID[0] = 0xffffffff;
    pRVar2->instPrimID[0] = 0xffffffff;
  }
  return bVar16;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }